

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O2

OPJ_BOOL opj_jp2_read_jp2h(opj_jp2_t *jp2,OPJ_BYTE *p_header_data,OPJ_UINT32 p_header_size,
                          opj_event_mgr_t *p_manager)

{
  OPJ_UINT32 OVar1;
  OPJ_BOOL OVar2;
  opj_jp2_header_handler_t *poVar3;
  int iVar4;
  char *pcVar5;
  OPJ_UINT32 OVar6;
  uint uVar7;
  bool bVar8;
  OPJ_UINT32 l_value;
  opj_event_mgr_t *local_50;
  opj_jp2_t *local_48;
  int local_3c;
  OPJ_UINT32 local_38;
  OPJ_UINT32 local_34;
  
  if (p_header_data == (OPJ_BYTE *)0x0) {
    __assert_fail("p_header_data != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/jp2.c"
                  ,0xa93,
                  "OPJ_BOOL opj_jp2_read_jp2h(opj_jp2_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (jp2 == (opj_jp2_t *)0x0) {
    __assert_fail("jp2 != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/jp2.c"
                  ,0xa94,
                  "OPJ_BOOL opj_jp2_read_jp2h(opj_jp2_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (p_manager == (opj_event_mgr_t *)0x0) {
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/jp2.c"
                  ,0xa95,
                  "OPJ_BOOL opj_jp2_read_jp2h(opj_jp2_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if ((jp2->jp2_state & 2) == 0) {
    pcVar5 = "The  box must be the first box in the file.\n";
  }
  else {
    jp2->jp2_img_state = 0;
    iVar4 = 0;
    local_50 = p_manager;
    local_48 = jp2;
    while (p_header_size != 0) {
      if (p_header_size < 8) {
        pcVar5 = "Cannot handle box of less than 8 bytes\n";
LAB_00123c43:
        opj_event_msg(p_manager,1,pcVar5);
        pcVar5 = "Stream error while reading JP2 Header box\n";
        goto LAB_00123c5c;
      }
      local_3c = iVar4;
      opj_read_bytes_LE(p_header_data,&l_value,4);
      OVar6 = l_value;
      opj_read_bytes_LE(p_header_data + 4,&l_value,4);
      local_38 = l_value;
      if (OVar6 == 1) {
        if (p_header_size < 0x10) {
          pcVar5 = "Cannot handle XL box of less than 16 bytes\n";
        }
        else {
          opj_read_bytes_LE(p_header_data + 8,&local_34,4);
          if (local_34 == 0) {
            opj_read_bytes_LE(p_header_data + 0xc,&l_value,4);
            if (l_value != 0) {
              uVar7 = 0x10;
              OVar6 = l_value;
              goto LAB_00123b5d;
            }
            pcVar5 = "Cannot handle box of undefined sizes\n";
          }
          else {
            pcVar5 = "Cannot handle box sizes higher than 2^32\n";
          }
        }
        goto LAB_00123c43;
      }
      uVar7 = 8;
      if (OVar6 == 0) {
        pcVar5 = "Cannot handle box of undefined sizes\n";
        p_manager = local_50;
        goto LAB_00123c43;
      }
LAB_00123b5d:
      OVar1 = local_38;
      p_manager = local_50;
      if (OVar6 < uVar7) {
        pcVar5 = "Box length is inconsistent.\n";
        goto LAB_00123c43;
      }
      bVar8 = p_header_size < OVar6;
      p_header_size = p_header_size - OVar6;
      if (bVar8) {
        pcVar5 = "Stream error while reading JP2 Header box: box length is inconsistent.\n";
        goto LAB_00123c5c;
      }
      poVar3 = opj_jp2_img_find_handler(local_38);
      p_manager = local_50;
      if (poVar3 == (opj_jp2_header_handler_t *)0x0) {
        local_48->jp2_img_state = local_48->jp2_img_state | 0x7fffffff;
      }
      else {
        OVar2 = (*poVar3->handler)(local_48,p_header_data + uVar7,OVar6 - uVar7,local_50);
        if (OVar2 == 0) {
          return 0;
        }
      }
      iVar4 = local_3c;
      if (OVar1 == 0x69686472) {
        iVar4 = 1;
      }
      p_header_data = p_header_data + uVar7 + (OVar6 - uVar7);
    }
    if (iVar4 != 0) {
      *(byte *)&local_48->jp2_state = (byte)local_48->jp2_state | 4;
      local_48->has_jp2h = '\x01';
      return 1;
    }
    pcVar5 = "Stream error while reading JP2 Header box: no \'ihdr\' box.\n";
  }
LAB_00123c5c:
  opj_event_msg(p_manager,1,pcVar5);
  return 0;
}

Assistant:

static OPJ_BOOL opj_jp2_read_jp2h(opj_jp2_t *jp2,
                                  OPJ_BYTE *p_header_data,
                                  OPJ_UINT32 p_header_size,
                                  opj_event_mgr_t * p_manager
                                 )
{
    OPJ_UINT32 l_box_size = 0, l_current_data_size = 0;
    opj_jp2_box_t box;
    const opj_jp2_header_handler_t * l_current_handler;
    OPJ_BOOL l_has_ihdr = 0;

    /* preconditions */
    assert(p_header_data != 00);
    assert(jp2 != 00);
    assert(p_manager != 00);

    /* make sure the box is well placed */
    if ((jp2->jp2_state & JP2_STATE_FILE_TYPE) != JP2_STATE_FILE_TYPE) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "The  box must be the first box in the file.\n");
        return OPJ_FALSE;
    }

    jp2->jp2_img_state = JP2_IMG_STATE_NONE;

    /* iterate while remaining data */
    while (p_header_size > 0) {

        if (! opj_jp2_read_boxhdr_char(&box, p_header_data, &l_box_size, p_header_size,
                                       p_manager)) {
            opj_event_msg(p_manager, EVT_ERROR,
                          "Stream error while reading JP2 Header box\n");
            return OPJ_FALSE;
        }

        if (box.length > p_header_size) {
            opj_event_msg(p_manager, EVT_ERROR,
                          "Stream error while reading JP2 Header box: box length is inconsistent.\n");
            return OPJ_FALSE;
        }

        l_current_handler = opj_jp2_img_find_handler(box.type);
        l_current_data_size = box.length - l_box_size;
        p_header_data += l_box_size;

        if (l_current_handler != 00) {
            if (! l_current_handler->handler(jp2, p_header_data, l_current_data_size,
                                             p_manager)) {
                return OPJ_FALSE;
            }
        } else {
            jp2->jp2_img_state |= JP2_IMG_STATE_UNKNOWN;
        }

        if (box.type == JP2_IHDR) {
            l_has_ihdr = 1;
        }

        p_header_data += l_current_data_size;
        p_header_size -= box.length;
    }

    if (l_has_ihdr == 0) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Stream error while reading JP2 Header box: no 'ihdr' box.\n");
        return OPJ_FALSE;
    }

    jp2->jp2_state |= JP2_STATE_HEADER;
    jp2->has_jp2h = 1;

    return OPJ_TRUE;
}